

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pMiter;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  Fraig_Params_t Params;
  char Buffer [100];
  uint local_f4;
  uint local_f0;
  undefined8 local_e8;
  ulong uStack_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Abc_Frame_t *local_a8;
  Abc_Ntk_t *local_a0;
  char local_98 [104];
  
  local_a8 = pAbc;
  local_a0 = Abc_FrameReadNtk(pAbc);
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_e8 = 0x80000000800;
  uStack_e0 = 100;
  local_d8 = 0x100000001;
  uStack_d0 = 0x100000001;
  local_f4 = 0;
  Extra_UtilGetoptReset();
  local_f0 = 0;
  bVar1 = false;
LAB_0025f520:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"RDCrscptvaeh"), pAVar3 = local_a0,
          iVar5 = globalUtilOptind, 0x62 < iVar2) {
      switch(iVar2) {
      case 0x70:
        local_c8 = local_c8 ^ 0x100000000;
        break;
      case 0x71:
      case 0x75:
        goto switchD_0025f542_caseD_71;
      case 0x72:
        local_d8 = local_d8 ^ 1;
        break;
      case 0x73:
        uStack_d0 = uStack_d0 ^ 0x100000000;
        break;
      case 0x74:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x76:
        uStack_c0 = uStack_c0 ^ 1;
        break;
      default:
        if (iVar2 == 99) {
          local_c8 = local_c8 ^ 1;
        }
        else {
          if (iVar2 != 0x65) goto switchD_0025f542_caseD_71;
          local_f0 = local_f0 ^ 1;
        }
      }
    }
    if (iVar2 < 0x52) {
      if (iVar2 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0025f69d:
          Abc_Print(-1,pcVar4);
          goto switchD_0025f542_caseD_71;
        }
        iVar2 = atoi(argv[globalUtilOptind]);
        uStack_e0 = CONCAT44(uStack_e0._4_4_,iVar2);
      }
      else {
        if (iVar2 != 0x44) {
          if (iVar2 == -1) {
            if (local_a0 == (Abc_Ntk_t *)0x0) {
              pcVar4 = "Empty network.\n";
            }
            else if ((local_a0->ntkType & ~ABC_NTK_NETLIST) == ABC_NTK_LOGIC) {
              uStack_c0 = CONCAT44(local_c8._4_4_,(int)uStack_c0);
              if (bVar1) {
                pMiter = Abc_NtkDup(local_a0);
                if (pAVar3->ntkType == ABC_NTK_STRASH) {
                  Abc_NtkFraigPartitionedTime(pAVar3,&local_e8);
                }
                else {
                  pAVar3 = Abc_NtkStrash(pAVar3,local_f4,(uint)(local_f4 == 0),0);
                  Abc_NtkFraigPartitionedTime(pAVar3,&local_e8);
LAB_0025f92f:
                  Abc_NtkDelete(pAVar3);
                }
              }
              else {
                if (local_a0->ntkType != ABC_NTK_STRASH) {
                  pAVar3 = Abc_NtkStrash(local_a0,local_f4,(uint)(local_f4 == 0),0);
                  pMiter = Abc_NtkFraig(pAVar3,&local_e8,local_f4,local_f0);
                  goto LAB_0025f92f;
                }
                pMiter = Abc_NtkFraig(local_a0,&local_e8,local_f4,local_f0);
              }
              if (pMiter != (Abc_Ntk_t *)0x0) {
                if (local_c8._4_4_ != 0) {
                  Abc_NtkMiterReport(pMiter);
                }
                Abc_FrameReplaceCurrentNetwork(local_a8,pMiter);
                return 0;
              }
              pcVar4 = "Fraiging has failed.\n";
            }
            else {
              pcVar4 = "Can only fraig a logic network or an AIG.\n";
            }
            iVar5 = -1;
            goto LAB_0025f87d;
          }
          goto switchD_0025f542_caseD_71;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
          goto LAB_0025f69d;
        }
        iVar2 = atoi(argv[globalUtilOptind]);
        local_e8 = CONCAT44(iVar2,(undefined4)local_e8);
      }
    }
    else {
      if (iVar2 != 0x52) {
        if (iVar2 != 0x61) goto switchD_0025f542_caseD_71;
        local_f4 = local_f4 ^ 1;
        goto LAB_0025f520;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_0025f69d;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      local_e8 = CONCAT44(local_e8._4_4_,iVar2);
    }
    globalUtilOptind = iVar5 + 1;
    if (iVar2 < 0) {
switchD_0025f542_caseD_71:
      sprintf(local_98,"%d",uStack_e0 & 0xffffffff);
      Abc_Print(-2,"usage: fraig [-R num] [-D num] [-C num] [-rscpvtah]\n");
      Abc_Print(-2,"\t         transforms a logic network into a functionally reduced AIG\n");
      Abc_Print(-2,"\t         (known bugs: takes an UNSAT miter and returns a SAT one)\n");
      Abc_Print(-2,"\t         (there are newer fraiging commands, \"ifraig\" and \"dfraig\")\n");
      Abc_Print(-2,"\t-R num : number of random patterns (127 < num < 32769) [default = %d]\n",
                local_e8 & 0xffffffff);
      Abc_Print(-2,"\t-D num : number of systematic patterns (127 < num < 32769) [default = %d]\n",
                local_e8 >> 0x20);
      pcVar4 = "infinity";
      if ((int)uStack_e0 != -1) {
        pcVar4 = local_98;
      }
      Abc_Print(-2,"\t-C num : number of backtracks for one SAT problem [default = %s]\n",pcVar4);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if ((int)local_d8 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle functional reduction [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (uStack_d0._4_4_ == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle considering sparse functions [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if ((int)local_c8 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle accumulation of choices [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_c8._4_4_ == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle proving the miter outputs [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if ((int)uStack_c0 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_f0 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle functional sweeping using EXDC [default = %s]\n",pcVar4);
      pcVar4 = "all";
      if (local_f4 == 0) {
        pcVar4 = "dfs";
      }
      Abc_Print(-2,"\t-a     : toggle between all nodes and DFS nodes [default = %s]\n",pcVar4);
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using partitioned representation [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0025f87d:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[100];
    Fraig_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fAllNodes;
    int fExdc;
    int c;
    int fPartition = 0;
    extern void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fExdc     = 0;
    fAllNodes = 0;
    memset( pParams, 0, sizeof(Fraig_Params_t) );
    pParams->nPatsRand  = 2048; // the number of words of random simulation info
    pParams->nPatsDyna  = 2048; // the number of words of dynamic simulation info
    pParams->nBTLimit   =  100; // the max number of backtracks to perform
    pParams->fFuncRed   =    1; // performs only one level hashing
    pParams->fFeedBack  =    1; // enables solver feedback
    pParams->fDist1Pats =    1; // enables distance-1 patterns
    pParams->fDoSparse  =    1; // performs equiv tests for sparse functions
    pParams->fChoicing  =    0; // enables recording structural choices
    pParams->fTryProve  =    0; // tries to solve the final miter
    pParams->fVerbose   =    0; // the verbosiness flag
    pParams->fVerboseP  =    0; // the verbosiness flag
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "RDCrscptvaeh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nPatsRand = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nPatsRand < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nPatsDyna = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nPatsDyna < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nBTLimit < 0 )
                goto usage;
            break;

        case 'r':
            pParams->fFuncRed ^= 1;
            break;
        case 's':
            pParams->fDoSparse ^= 1;
            break;
        case 'c':
            pParams->fChoicing ^= 1;
            break;
        case 'p':
            pParams->fTryProve ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 't':
            fPartition ^= 1;
            break;
        case 'a':
            fAllNodes ^= 1;
            break;
        case 'e':
            fExdc ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only fraig a logic network or an AIG.\n" );
        return 1;
    }

    // report the proof
    pParams->fVerboseP = pParams->fTryProve;

    // get the new network
    if ( fPartition )
    {
        pNtkRes = Abc_NtkDup( pNtk );
        if ( Abc_NtkIsStrash(pNtk) )
            Abc_NtkFraigPartitionedTime( pNtk, &Params );
        else
        {
            pNtk = Abc_NtkStrash( pNtk, fAllNodes, !fAllNodes, 0 );
            Abc_NtkFraigPartitionedTime( pNtk, &Params );
            Abc_NtkDelete( pNtk );
        }
    }
    else
    {
        if ( Abc_NtkIsStrash(pNtk) )
            pNtkRes = Abc_NtkFraig( pNtk, &Params, fAllNodes, fExdc );
        else
        {
            pNtk = Abc_NtkStrash( pNtk, fAllNodes, !fAllNodes, 0 );
            pNtkRes = Abc_NtkFraig( pNtk, &Params, fAllNodes, fExdc );
            Abc_NtkDelete( pNtk );
        }
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Fraiging has failed.\n" );
        return 1;
    }

    if ( pParams->fTryProve ) // report the result
        Abc_NtkMiterReport( pNtkRes );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    sprintf(Buffer, "%d", pParams->nBTLimit );
    Abc_Print( -2, "usage: fraig [-R num] [-D num] [-C num] [-rscpvtah]\n" );
    Abc_Print( -2, "\t         transforms a logic network into a functionally reduced AIG\n" );
    Abc_Print( -2, "\t         (known bugs: takes an UNSAT miter and returns a SAT one)\n");
    Abc_Print( -2, "\t         (there are newer fraiging commands, \"ifraig\" and \"dfraig\")\n" );
    Abc_Print( -2, "\t-R num : number of random patterns (127 < num < 32769) [default = %d]\n",     pParams->nPatsRand );
    Abc_Print( -2, "\t-D num : number of systematic patterns (127 < num < 32769) [default = %d]\n", pParams->nPatsDyna );
    Abc_Print( -2, "\t-C num : number of backtracks for one SAT problem [default = %s]\n",    pParams->nBTLimit==-1? "infinity" : Buffer );
    Abc_Print( -2, "\t-r     : toggle functional reduction [default = %s]\n",                 pParams->fFuncRed? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle considering sparse functions [default = %s]\n",         pParams->fDoSparse? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle accumulation of choices [default = %s]\n",              pParams->fChoicing? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle proving the miter outputs [default = %s]\n",              pParams->fTryProve? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                       pParams->fVerbose?  "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle functional sweeping using EXDC [default = %s]\n",       fExdc? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle between all nodes and DFS nodes [default = %s]\n",      fAllNodes? "all": "dfs" );
    Abc_Print( -2, "\t-t     : toggle using partitioned representation [default = %s]\n",     fPartition? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}